

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

void interp1(double *x,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *index;
  double s;
  int local_50;
  int i_2;
  int i_1;
  int i;
  int *k;
  double *h;
  double *yi_local;
  int xi_length_local;
  double *xi_local;
  int x_length_local;
  double *y_local;
  double *x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(x_length + -1);
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)xi_length;
  uVar3 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  index = (int *)operator_new__(uVar3);
  for (i_2 = 0; i_2 < x_length + -1; i_2 = i_2 + 1) {
    *(double *)((long)pvVar4 + (long)i_2 * 8) = x[i_2 + 1] - x[i_2];
  }
  for (local_50 = 0; local_50 < xi_length; local_50 = local_50 + 1) {
    index[local_50] = 0;
  }
  histc(x,x_length,xi,xi_length,index);
  for (s._4_4_ = 0; s._4_4_ < xi_length; s._4_4_ = s._4_4_ + 1) {
    yi[s._4_4_] = ((xi[s._4_4_] - x[index[s._4_4_] + -1]) /
                  *(double *)((long)pvVar4 + (long)(index[s._4_4_] + -1) * 8)) *
                  (y[index[s._4_4_]] - y[index[s._4_4_] + -1]) + y[index[s._4_4_] + -1];
  }
  if (index != (int *)0x0) {
    operator_delete__(index);
  }
  if (pvVar4 != (void *)0x0) {
    operator_delete__(pvVar4);
  }
  return;
}

Assistant:

void interp1(const double *x, const double *y, int x_length, const double *xi,
    int xi_length, double *yi) {
  double *h = new double[x_length - 1];
  int *k = new int[xi_length];

  for (int i = 0; i < x_length - 1; ++i) h[i] = x[i + 1] - x[i];
  for (int i = 0; i < xi_length; ++i) {
    k[i] = 0;
  }

  histc(x, x_length, xi, xi_length, k);

  for (int i = 0; i < xi_length; ++i) {
    double s = (xi[i] - x[k[i] - 1]) / h[k[i] - 1];
    yi[i] = y[k[i] - 1] + s * (y[k[i]] - y[k[i] - 1]);
  }
  
  delete[] k;
  delete[] h;
}